

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

int __thiscall
raspicam::_private::Private_Impl_Still::startCapture
          (Private_Impl_Still *this,imageTakenCallback userCallback,uchar *preallocated_data,
          uint offset,uint length)

{
  int iVar1;
  Private_Impl_Still *this_00;
  undefined4 in_ECX;
  MMAL_PORT_T *in_RDX;
  MMAL_CONNECTION_T *in_RSI;
  MMAL_COMPONENT_T *in_RDI;
  undefined4 in_R8D;
  RASPICAM_USERDATA *userdata;
  
  this_00 = (Private_Impl_Still *)operator_new(0x38);
  memset(this_00,0,0x38);
  this_00->camera = in_RDI;
  this_00->encoder = *(MMAL_COMPONENT_T **)&in_RDI->is_enabled;
  this_00->encoder_pool = (MMAL_POOL_T *)0x0;
  this_00->camera_still_port = in_RDX;
  *(undefined4 *)&this_00->encoder_input_port = 0;
  *(undefined4 *)&this_00->encoder_output_port = in_ECX;
  *(undefined4 *)((long)&this_00->encoder_input_port + 4) = in_ECX;
  *(undefined4 *)((long)&this_00->encoder_output_port + 4) = in_R8D;
  this_00->encoder_connection = in_RSI;
  in_RDI->input[10] = (MMAL_PORT_T *)this_00;
  iVar1 = startCapture(this_00);
  return iVar1;
}

Assistant:

int Private_Impl_Still::startCapture ( imageTakenCallback userCallback, unsigned char * preallocated_data, unsigned int offset, unsigned int length ) {
            RASPICAM_USERDATA * userdata = new RASPICAM_USERDATA();
            userdata->cameraBoard = this;
            userdata->encoderPool = encoder_pool;
            userdata->mutex = NULL;
            userdata->data = preallocated_data;
            userdata->bufferPosition = 0;
            userdata->offset = offset;
            userdata->startingOffset = offset;
            userdata->length = length;
            userdata->imageCallback = userCallback;
            encoder_output_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) userdata;
            return startCapture();
        }